

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall GameBoard::spawn_apple(GameBoard *this)

{
  bool bVar1;
  Apple *this_00;
  Apple *local_18;
  GameBoard *local_10;
  GameBoard *this_local;
  
  local_10 = this;
  bVar1 = std::vector<Apple_*,_std::allocator<Apple_*>_>::empty(&this->apples);
  if (!bVar1) {
    std::vector<Apple_*,_std::allocator<Apple_*>_>::pop_back(&this->apples);
  }
  this_00 = (Apple *)operator_new(0x10);
  Apple::Apple(this_00,this);
  local_18 = this_00;
  std::vector<Apple_*,_std::allocator<Apple_*>_>::push_back(&this->apples,&local_18);
  return;
}

Assistant:

void GameBoard::spawn_apple() {
    if(!this->apples.empty()) {
        this->apples.pop_back();
    }
    this->apples.push_back(new Apple(this));
}